

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O0

void deqp::gles31::Functional::logCubeArrayTexCoords
               (TestLog *log,vector<float,_std::allocator<float>_> *texCoord)

{
  size_type sVar1;
  reference pvVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_1c0;
  value_type local_40;
  value_type local_3c;
  float q;
  float w;
  float v;
  float u;
  size_t coordNdx;
  size_t vertNdx;
  size_t numVerts;
  vector<float,_std::allocator<float>_> *texCoord_local;
  TestLog *log_local;
  
  numVerts = (size_t)texCoord;
  texCoord_local = (vector<float,_std::allocator<float>_> *)log;
  sVar1 = std::vector<float,_std::allocator<float>_>::size(texCoord);
  vertNdx = sVar1 >> 2;
  for (coordNdx = 0; coordNdx < vertNdx; coordNdx = coordNdx + 1) {
    _v = coordNdx << 2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)numVerts,_v);
    w = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)numVerts,_v + 1);
    q = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)numVerts,_v + 2);
    local_3c = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)numVerts,_v + 3);
    local_40 = *pvVar2;
    tcu::TestLog::operator<<
              (&local_1c0,(TestLog *)texCoord_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1c0,&coordNdx);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [4])0x2be0a0c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&w);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&q);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_3c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_40);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2a85ff4);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  }
  return;
}

Assistant:

static void logCubeArrayTexCoords(TestLog& log, vector<float>& texCoord)
{
	const size_t numVerts = texCoord.size() / 4;

	DE_ASSERT(texCoord.size() % 4 == 0);

	for (size_t vertNdx = 0; vertNdx < numVerts; vertNdx++)
	{
		const size_t	coordNdx	= vertNdx * 4;

		const float		u			= texCoord[coordNdx + 0];
		const float		v			= texCoord[coordNdx + 1];
		const float		w			= texCoord[coordNdx + 2];
		const float		q			= texCoord[coordNdx + 3];

		log << TestLog::Message
			<< vertNdx << ": ("
			<< u << ", "
			<< v << ", "
			<< w << ", "
			<< q << ")"
			<< TestLog::EndMessage;
	}
}